

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputKey(ostream *fout,string *key)

{
  string_view str;
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  bool local_31;
  char *q;
  string *key_local;
  ostream *fout_local;
  
  lVar2 = std::__cxx11::string::find((char)key,0x3a);
  local_31 = true;
  if (lVar2 == -1) {
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)key);
    local_31 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0xc1e111);
  }
  pcVar1 = "PK\x01\x02";
  if (local_31 != false) {
    pcVar1 = "\n\t\t\t\"";
  }
  poVar3 = std::operator<<(fout,pcVar1 + 4);
  poVar3 = std::operator<<(poVar3,(string *)key);
  std::operator<<(poVar3,pcVar1 + 4);
  return;
}

Assistant:

void cmCacheManager::OutputKey(std::ostream& fout, std::string const& key)
{
  // support : in key name by double quoting
  const char* q =
    (key.find(':') != std::string::npos || cmHasLiteralPrefix(key, "//"))
    ? "\""
    : "";
  fout << q << key << q;
}